

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_binary_op.cxx
# Opt level: O0

void __thiscall HAXX_BINARY_OP::complex_binary_add::test_method(complex_binary_add *this)

{
  undefined8 uVar1;
  bool bVar2;
  double dVar3;
  complex<double> x;
  quaternion<double> r;
  quaternion<double> p;
  quaternion<double> q;
  char *in_stack_fffffffffffff668;
  quaternion<double> *in_stack_fffffffffffff670;
  char *in_stack_fffffffffffff678;
  undefined1 local_660 [32];
  undefined1 local_640 [40];
  undefined1 local_618 [16];
  basic_cstring<const_char> local_608;
  double local_5f8;
  undefined1 local_5f0 [32];
  undefined1 local_5d0 [40];
  undefined1 local_5a8 [16];
  basic_cstring<const_char> local_598;
  double local_588;
  undefined1 local_580 [32];
  undefined1 local_560 [40];
  undefined1 local_538 [16];
  basic_cstring<const_char> local_528;
  double local_518;
  undefined1 local_510 [32];
  undefined1 local_4f0 [40];
  undefined1 local_4c8 [16];
  basic_cstring<const_char> local_4b8;
  double local_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [40];
  undefined1 local_458 [16];
  basic_cstring<const_char> local_448;
  double local_438;
  undefined1 local_430 [32];
  undefined1 local_410 [40];
  undefined1 local_3e8 [16];
  basic_cstring<const_char> local_3d8;
  double local_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [40];
  undefined1 local_378 [16];
  basic_cstring<const_char> local_368;
  double local_358;
  undefined1 local_350 [32];
  undefined1 local_330 [40];
  undefined1 local_308 [16];
  basic_cstring<const_char> local_2f8;
  double local_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [40];
  undefined1 local_298 [16];
  basic_cstring<const_char> local_288;
  double local_278;
  undefined1 local_270 [32];
  undefined1 local_250 [40];
  undefined1 local_228 [16];
  basic_cstring<const_char> local_218;
  double local_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [40];
  undefined1 local_1b8 [16];
  basic_cstring<const_char> local_1a8;
  double local_198;
  quaternion<double> local_190;
  basic_cstring<const_char> local_170;
  undefined1 local_160 [40];
  undefined1 local_138 [16];
  basic_cstring<const_char> local_128;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  complex<double> local_d8;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  quaternion<double> local_a8;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  quaternion<double> local_68;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  quaternion<double> local_28;
  
  local_30 = 1.0;
  local_38 = 2.0;
  local_40 = 3.0;
  local_48 = 4.0;
  HAXX::quaternion<double>::quaternion(&local_28,&local_30,&local_38,&local_40,&local_48);
  local_70 = 0.0;
  local_78 = 0.0;
  local_80 = 0.0;
  local_88 = 0.0;
  HAXX::quaternion<double>::quaternion(&local_68,&local_70,&local_78,&local_80,&local_88);
  local_b0 = 0.0;
  local_b8 = 0.0;
  local_c0 = 0.0;
  local_c8 = 0.0;
  HAXX::quaternion<double>::quaternion(&local_a8,&local_b0,&local_b8,&local_c0,&local_c8);
  std::complex<double>::complex(&local_d8,-4.59,4.928364);
  HAXX::operator+(in_stack_fffffffffffff670,(complex<double> *)in_stack_fffffffffffff668);
  local_68._M_real = local_f8;
  local_68._M_imag_i = local_f0;
  local_68._M_imag_j = local_e8;
  local_68._M_imag_k = local_e0;
  HAXX::operator+((complex<double> *)in_stack_fffffffffffff670,
                  (quaternion<double> *)in_stack_fffffffffffff668);
  local_a8._M_real = local_118;
  local_a8._M_imag_i = local_110;
  local_a8._M_imag_j = local_108;
  local_a8._M_imag_k = local_100;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff670);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_128,0x7d,local_138);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff678,(char (*) [1])in_stack_fffffffffffff670);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_170,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_190._M_imag_i = HAXX::quaternion<double>::real(&local_68);
    dVar3 = HAXX::quaternion<double>::real(&local_28);
    local_190._M_real = std::complex<double>::real_abi_cxx11_(&local_d8);
    local_190._M_real = dVar3 + local_190._M_real;
    local_198 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff668);
    in_stack_fffffffffffff678 = "q.real() + x.real()";
    in_stack_fffffffffffff670 = &local_190;
    in_stack_fffffffffffff668 = "p.real()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_160,&local_170,0x7d,1,8,&local_190._M_imag_i);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x198875);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff670);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1a8,0x7e,local_1b8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff678,(char (*) [1])in_stack_fffffffffffff670);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_200 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_200._8_8_ = HAXX::quaternion<double>::imag_i(&local_68);
    dVar3 = HAXX::quaternion<double>::imag_i(&local_28);
    local_200._0_8_ = std::complex<double>::imag_abi_cxx11_(&local_d8);
    local_200._0_8_ = dVar3 + (double)local_200._0_8_;
    local_208 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff668);
    in_stack_fffffffffffff678 = "q.imag_i() + x.imag()";
    in_stack_fffffffffffff670 = (quaternion<double> *)local_200;
    in_stack_fffffffffffff668 = "p.imag_i()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_1e0,local_200 + 0x10,0x7e,1,8,local_200 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x198a50);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff670);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_218,0x7f,local_228);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff678,(char (*) [1])in_stack_fffffffffffff670);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_270 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_270._8_8_ = HAXX::quaternion<double>::imag_j(&local_68);
    local_270._0_8_ = HAXX::quaternion<double>::imag_j(&local_28);
    local_278 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff668);
    in_stack_fffffffffffff678 = "q.imag_j()";
    in_stack_fffffffffffff670 = (quaternion<double> *)local_270;
    in_stack_fffffffffffff668 = "p.imag_j()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_250,local_270 + 0x10,0x7f,1,8,local_270 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x198c06);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff670);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_288,0x80,local_298);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff678,(char (*) [1])in_stack_fffffffffffff670);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_2e0 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_2e0._8_8_ = HAXX::quaternion<double>::imag_k(&local_68);
    local_2e0._0_8_ = HAXX::quaternion<double>::imag_k(&local_28);
    local_2e8 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff668);
    in_stack_fffffffffffff678 = "q.imag_k()";
    in_stack_fffffffffffff670 = (quaternion<double> *)local_2e0;
    in_stack_fffffffffffff668 = "p.imag_k()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_2c0,local_2e0 + 0x10,0x80,1,8,local_2e0 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x198dbc);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff670);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2f8,0x82,local_308);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff678,(char (*) [1])in_stack_fffffffffffff670);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_350 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_350._8_8_ = HAXX::quaternion<double>::real(&local_a8);
    dVar3 = HAXX::quaternion<double>::real(&local_28);
    local_350._0_8_ = std::complex<double>::real_abi_cxx11_(&local_d8);
    local_350._0_8_ = dVar3 + (double)local_350._0_8_;
    local_358 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff668);
    in_stack_fffffffffffff678 = "q.real() + x.real()";
    in_stack_fffffffffffff670 = (quaternion<double> *)local_350;
    in_stack_fffffffffffff668 = "r.real()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_330,local_350 + 0x10,0x82,1,8,local_350 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x198f97);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff670);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_368,0x83,local_378);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff678,(char (*) [1])in_stack_fffffffffffff670);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_3c0 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_3c0._8_8_ = HAXX::quaternion<double>::imag_i(&local_a8);
    dVar3 = HAXX::quaternion<double>::imag_i(&local_28);
    local_3c0._0_8_ = std::complex<double>::imag_abi_cxx11_(&local_d8);
    local_3c0._0_8_ = dVar3 + (double)local_3c0._0_8_;
    local_3c8 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff668);
    in_stack_fffffffffffff678 = "q.imag_i() + x.imag()";
    in_stack_fffffffffffff670 = (quaternion<double> *)local_3c0;
    in_stack_fffffffffffff668 = "r.imag_i()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_3a0,local_3c0 + 0x10,0x83,1,8,local_3c0 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x199172);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff670);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3d8,0x84,local_3e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff678,(char (*) [1])in_stack_fffffffffffff670);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_430 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_430._8_8_ = HAXX::quaternion<double>::imag_j(&local_a8);
    local_430._0_8_ = HAXX::quaternion<double>::imag_j(&local_28);
    local_438 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff668);
    in_stack_fffffffffffff678 = "q.imag_j()";
    in_stack_fffffffffffff670 = (quaternion<double> *)local_430;
    in_stack_fffffffffffff668 = "r.imag_j()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_410,local_430 + 0x10,0x84,1,8,local_430 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x199328);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_448,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff670);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_448,0x85,local_458);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff678,(char (*) [1])in_stack_fffffffffffff670);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_4a0 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_4a0._8_8_ = HAXX::quaternion<double>::imag_k(&local_a8);
    local_4a0._0_8_ = HAXX::quaternion<double>::imag_k(&local_28);
    local_4a8 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff668);
    in_stack_fffffffffffff678 = "q.imag_k()";
    in_stack_fffffffffffff670 = (quaternion<double> *)local_4a0;
    in_stack_fffffffffffff668 = "r.imag_k()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_480,local_4a0 + 0x10,0x85,1,8,local_4a0 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1994de);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff670);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4b8,0x87,local_4c8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff678,(char (*) [1])in_stack_fffffffffffff670);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_510 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_510._8_8_ = HAXX::quaternion<double>::real(&local_28);
    local_510._0_8_ = 1.0;
    local_518 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff668);
    in_stack_fffffffffffff678 = "1.";
    in_stack_fffffffffffff670 = (quaternion<double> *)local_510;
    in_stack_fffffffffffff668 = "q.real()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_4f0,local_510 + 0x10,0x87,1,8,local_510 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x19967c);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_528,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff670);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_528,0x88,local_538);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff678,(char (*) [1])in_stack_fffffffffffff670);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_580 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_580._8_8_ = HAXX::quaternion<double>::imag_i(&local_28);
    local_580._0_8_ = 2.0;
    local_588 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff668);
    in_stack_fffffffffffff678 = "2.";
    in_stack_fffffffffffff670 = (quaternion<double> *)local_580;
    in_stack_fffffffffffff668 = "q.imag_i()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_560,local_580 + 0x10,0x88,1,8,local_580 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x19981a);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_598,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff670);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_598,0x89,local_5a8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff678,(char (*) [1])in_stack_fffffffffffff670);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_5f0 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_5f0._8_8_ = HAXX::quaternion<double>::imag_j(&local_28);
    local_5f0._0_8_ = 3.0;
    local_5f8 = (double)boost::math::fpc::percent_tolerance<double>
                                  ((double)in_stack_fffffffffffff668);
    in_stack_fffffffffffff678 = "3.";
    in_stack_fffffffffffff670 = (quaternion<double> *)local_5f0;
    in_stack_fffffffffffff668 = "q.imag_j()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_5d0,local_5f0 + 0x10,0x89,1,8,local_5f0 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1999a6);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_608,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff670);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_608,0x8a,local_618);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff678,(char (*) [1])in_stack_fffffffffffff670);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_660 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
               ,0x60);
    local_660._8_8_ = HAXX::quaternion<double>::imag_k(&local_28);
    local_660._0_8_ = 4.0;
    boost::math::fpc::percent_tolerance<double>((double)in_stack_fffffffffffff668);
    in_stack_fffffffffffff678 = "4.";
    in_stack_fffffffffffff670 = (quaternion<double> *)local_660;
    in_stack_fffffffffffff668 = "q.imag_k()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::check_is_close_t,double,double,boost::math::fpc::percent_tolerance_t<double>>
              (local_640,local_660 + 0x10,0x8a,1,8,local_660 + 8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x199b1a);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(complex_binary_add)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.),p,r;
  std::complex<double> x(-4.59,4.928364);
  p = q + x;
  r = x + q;

  BOOST_CHECK_CLOSE(p.real(),  q.real() + x.real()  , COMPARE_TOL  );
  BOOST_CHECK_CLOSE(p.imag_i(),q.imag_i() + x.imag(), COMPARE_TOL  );
  BOOST_CHECK_CLOSE(p.imag_j(),q.imag_j()           , COMPARE_TOL  );
  BOOST_CHECK_CLOSE(p.imag_k(),q.imag_k()           , COMPARE_TOL  );

  BOOST_CHECK_CLOSE(r.real(),  q.real() + x.real()  , COMPARE_TOL );
  BOOST_CHECK_CLOSE(r.imag_i(),q.imag_i() + x.imag(), COMPARE_TOL );
  BOOST_CHECK_CLOSE(r.imag_j(),q.imag_j()           , COMPARE_TOL );
  BOOST_CHECK_CLOSE(r.imag_k(),q.imag_k()           , COMPARE_TOL );

  BOOST_CHECK_CLOSE(q.real(),  1., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_i(),2., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_j(),3., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_k(),4., COMPARE_TOL);
}